

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O3

void Eigen::internal::LU_kernel_bmod<1>::
     run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int param_1,VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *param_3,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  PointerType pdVar6;
  int iVar7;
  int *piVar8;
  char *__function;
  long lVar9;
  double *pdVar10;
  uint uVar11;
  int iVar12;
  double dVar13;
  
  iVar7 = no_zeros + lptr;
  if (-1 < iVar7) {
    if ((long)iVar7 <
        (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      piVar8 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      lVar9 = (long)piVar8[iVar7];
      if ((-1 < lVar9) &&
         (lVar9 < (dense->super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>).
                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                  .m_rows.m_value)) {
        pdVar6 = (dense->super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>).
                 super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                 .m_data;
        dVar1 = pdVar6[lVar9];
        iVar12 = (lda + 1) * no_zeros;
        iVar7 = *luptr;
        *luptr = iVar12 + iVar7 + 1;
        pdVar10 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + (long)iVar12 + (long)iVar7 + 1;
        piVar8 = piVar8 + (long)lptr + (long)no_zeros + 1;
        uVar11 = 0;
        if (1 < nrow) {
          dVar13 = -dVar1;
          uVar11 = nrow & 0x7ffffffe;
          iVar7 = 1;
          do {
            iVar12 = *piVar8;
            iVar5 = piVar8[1];
            piVar8 = piVar8 + 2;
            dVar2 = *pdVar10;
            dVar3 = pdVar10[1];
            pdVar10 = pdVar10 + 2;
            dVar4 = pdVar6[iVar5];
            pdVar6[iVar12] = dVar2 * dVar13 + pdVar6[iVar12];
            pdVar6[iVar5] = dVar3 * dVar13 + dVar4;
            iVar7 = iVar7 + 2;
          } while (iVar7 < nrow);
        }
        if ((int)uVar11 < nrow) {
          pdVar6[*piVar8] = pdVar6[*piVar8] - dVar1 * *pdVar10;
        }
        return;
      }
      __function = 
      "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 1]"
      ;
      goto LAB_00152ff4;
    }
  }
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_00152ff4:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<1>::run(const int /*segsize*/, BlockScalarVector& dense, ScalarVector& /*tempv*/, ScalarVector& lusup, Index& luptr,
                                              const Index lda, const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  Scalar f = dense(lsub(lptr + no_zeros));
  luptr += lda * no_zeros + no_zeros + 1;
  const Scalar* a(lusup.data() + luptr);
  const /*typename IndexVector::Scalar*/Index*  irow(lsub.data()+lptr + no_zeros + 1);
  Index i = 0;
  for (; i+1 < nrow; i+=2)
  {
    Index i0 = *(irow++);
    Index i1 = *(irow++);
    Scalar a0 = *(a++);
    Scalar a1 = *(a++);
    Scalar d0 = dense.coeff(i0);
    Scalar d1 = dense.coeff(i1);
    d0 -= f*a0;
    d1 -= f*a1;
    dense.coeffRef(i0) = d0;
    dense.coeffRef(i1) = d1;
  }
  if(i<nrow)
    dense.coeffRef(*(irow++)) -= f * *(a++);
}